

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int flatcc_verify_table_as_typed_root_with_size
              (void *buf,size_t bufsiz,flatbuffers_thash_t thash,flatcc_table_verifier_f *tvf)

{
  size_t buf_00;
  int iVar1;
  flatbuffers_uoffset_t end;
  flatbuffers_uoffset_t offset;
  flatcc_table_verifier_f *tvf_local;
  size_t sStack_20;
  flatbuffers_thash_t thash_local;
  size_t bufsiz_local;
  void *buf_local;
  
  sStack_20 = bufsiz;
  bufsiz_local = (size_t)buf;
  iVar1 = flatcc_verify_typed_buffer_header_with_size(buf,&stack0xffffffffffffffe0,thash);
  buf_00 = bufsiz_local;
  if (iVar1 == 0) {
    end = (flatbuffers_uoffset_t)sStack_20;
    offset = read_uoffset((void *)bufsiz_local,4);
    buf_local._4_4_ = verify_table((void *)buf_00,end,4,offset,100,tvf);
  }
  else {
    buf_local._4_4_ =
         flatcc_verify_typed_buffer_header_with_size
                   ((void *)bufsiz_local,&stack0xffffffffffffffe0,thash);
  }
  return buf_local._4_4_;
}

Assistant:

int flatcc_verify_table_as_typed_root_with_size(const void *buf, size_t bufsiz, flatbuffers_thash_t thash, flatcc_table_verifier_f *tvf)
{
    check_result(flatcc_verify_typed_buffer_header_with_size(buf, &bufsiz, thash));
    return verify_table(buf, (uoffset_t)bufsiz, uoffset_size, read_uoffset(buf, uoffset_size), FLATCC_VERIFIER_MAX_LEVELS, tvf);
}